

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation.cpp
# Opt level: O2

void __thiscall mjs::value_representation::value_representation(value_representation *this,value *v)

{
  bool bVar1;
  object_ptr *poVar2;
  ulong uVar3;
  string *psVar4;
  double dVar5;
  ulong uVar6;
  wstring_view local_198;
  wostringstream woss;
  
  switch((ulong)v->type_) {
  case 0:
  case 1:
    uVar6 = ((ulong)v->type_ << 0x30) + 0x1000000000000;
    uVar3 = 0x7ff0000000000000;
    break;
  case 2:
    bVar1 = value::boolean_value(v);
    uVar6 = (ulong)bVar1;
    uVar3 = 0x7ff3000000000000;
    break;
  case 3:
    dVar5 = value::number_value(v);
    if (NAN(dVar5)) {
      dVar5 = NAN;
    }
    goto LAB_0015d65b;
  case 4:
    psVar4 = value::string_value(v);
    uVar6 = (ulong)(psVar4->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
    uVar3 = 0x7ff5000000000000;
    break;
  case 5:
    poVar2 = value::object_value(v);
    uVar6 = (ulong)(poVar2->super_gc_heap_ptr_untyped).pos_;
    uVar3 = 0x7ff6000000000000;
    break;
  default:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
    std::operator<<((wostream *)&woss,"Not handled: ");
    debug_print((wostream *)&woss,v,2,0x7fffffff,0);
    std::__cxx11::wstringbuf::str();
    throw_runtime_error(&local_198,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                        ,0x38);
  }
  dVar5 = (double)(uVar3 | uVar6);
LAB_0015d65b:
  this->repr_ = (uint64_t)dVar5;
  return;
}

Assistant:

value_representation::value_representation(const value& v) {
    switch (v.type()) {
    case value_type::undefined: [[fallthrough]];
    case value_type::null:      repr_ = make_repr(v.type(), 0); return;
    case value_type::boolean:   repr_ = make_repr(v.type(), v.boolean_value()); return;
    case value_type::number:    repr_ = number_repr(v.number_value()); return;
    case value_type::string:    repr_ = make_repr(v.type(), v.string_value().unsafe_raw_get().pos_); return;
    case value_type::object:    repr_ = make_repr(v.type(), v.object_value().pos_); return;
    case value_type::reference: break; // Not legal here
    }
    std::wostringstream woss;
    woss << "Not handled: ";
    debug_print(woss, v, 2);
    THROW_RUNTIME_ERROR(woss.str());
}